

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O3

int Load_ARB_invalidate_subdata(void)

{
  _func_void_GLenum_GLsizei_GLenum_ptr *p_Var1;
  _func_void_GLenum_GLsizei_GLenum_ptr_GLint_GLint_GLsizei_GLsizei *p_Var2;
  _func_void_GLuint_GLint *p_Var3;
  undefined4 in_ECX;
  int iVar4;
  uint uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  
  _ptrc_glInvalidateBufferData = (_func_void_GLuint *)glXGetProcAddressARB("glInvalidateBufferData")
  ;
  bVar6 = _ptrc_glInvalidateBufferData == (_func_void_GLuint *)0x0;
  _ptrc_glInvalidateBufferSubData =
       (_func_void_GLuint_GLintptr_GLsizeiptr *)glXGetProcAddressARB("glInvalidateBufferSubData");
  uVar5 = bVar6 + 1;
  if (_ptrc_glInvalidateBufferSubData != (_func_void_GLuint_GLintptr_GLsizeiptr *)0x0) {
    uVar5 = (uint)bVar6;
  }
  p_Var1 = (_func_void_GLenum_GLsizei_GLenum_ptr *)glXGetProcAddressARB("glInvalidateFramebuffer");
  _ptrc_glInvalidateFramebuffer = p_Var1;
  p_Var2 = (_func_void_GLenum_GLsizei_GLenum_ptr_GLint_GLint_GLsizei_GLsizei *)
           glXGetProcAddressARB("glInvalidateSubFramebuffer");
  _ptrc_glInvalidateSubFramebuffer = p_Var2;
  p_Var3 = (_func_void_GLuint_GLint *)glXGetProcAddressARB("glInvalidateTexImage");
  _ptrc_glInvalidateTexImage = p_Var3;
  _ptrc_glInvalidateTexSubImage =
       (_func_void_GLuint_GLint_GLint_GLint_GLint_GLsizei_GLsizei_GLsizei *)
       glXGetProcAddressARB("glInvalidateTexSubImage");
  auVar7._0_4_ = -(uint)((int)((ulong)p_Var1 >> 0x20) == 0 && (int)p_Var1 == 0);
  auVar7._4_4_ = -(uint)((int)p_Var2 == 0 && (int)((ulong)p_Var2 >> 0x20) == 0);
  auVar7._8_4_ = -(uint)((int)((ulong)p_Var3 >> 0x20) == 0 && (int)p_Var3 == 0);
  auVar7._12_4_ =
       -(uint)((int)_ptrc_glInvalidateTexSubImage == 0 &&
              (int)((ulong)_ptrc_glInvalidateTexSubImage >> 0x20) == 0);
  iVar4 = movmskps(in_ECX,auVar7);
  return ((uint)(0x4332322132212110 >> ((byte)(iVar4 << 2) & 0x3f)) & 7) + uVar5;
}

Assistant:

static int Load_ARB_invalidate_subdata(void)
{
	int numFailed = 0;
	_ptrc_glInvalidateBufferData = (void (CODEGEN_FUNCPTR *)(GLuint))IntGetProcAddress("glInvalidateBufferData");
	if(!_ptrc_glInvalidateBufferData) numFailed++;
	_ptrc_glInvalidateBufferSubData = (void (CODEGEN_FUNCPTR *)(GLuint, GLintptr, GLsizeiptr))IntGetProcAddress("glInvalidateBufferSubData");
	if(!_ptrc_glInvalidateBufferSubData) numFailed++;
	_ptrc_glInvalidateFramebuffer = (void (CODEGEN_FUNCPTR *)(GLenum, GLsizei, const GLenum *))IntGetProcAddress("glInvalidateFramebuffer");
	if(!_ptrc_glInvalidateFramebuffer) numFailed++;
	_ptrc_glInvalidateSubFramebuffer = (void (CODEGEN_FUNCPTR *)(GLenum, GLsizei, const GLenum *, GLint, GLint, GLsizei, GLsizei))IntGetProcAddress("glInvalidateSubFramebuffer");
	if(!_ptrc_glInvalidateSubFramebuffer) numFailed++;
	_ptrc_glInvalidateTexImage = (void (CODEGEN_FUNCPTR *)(GLuint, GLint))IntGetProcAddress("glInvalidateTexImage");
	if(!_ptrc_glInvalidateTexImage) numFailed++;
	_ptrc_glInvalidateTexSubImage = (void (CODEGEN_FUNCPTR *)(GLuint, GLint, GLint, GLint, GLint, GLsizei, GLsizei, GLsizei))IntGetProcAddress("glInvalidateTexSubImage");
	if(!_ptrc_glInvalidateTexSubImage) numFailed++;
	return numFailed;
}